

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# level.c
# Opt level: O1

void av1_update_level_info(AV1_COMP *cpi,size_t size,int64_t ts_start,int64_t ts_end)

{
  ulong uVar1;
  double dVar2;
  double dVar3;
  BITSTREAM_PROFILE profile;
  byte bVar4;
  byte level;
  int iVar5;
  int iVar6;
  undefined4 uVar7;
  undefined4 uVar11;
  AV1_PRIMARY *pAVar8;
  SequenceHeader *pSVar9;
  AV1LevelInfo *level_info;
  SequenceHeader *pSVar10;
  DECODER_MODEL_STATUS DVar12;
  int iVar13;
  TARGET_LEVEL_FAIL_ID TVar14;
  int *piVar15;
  int *piVar16;
  int *piVar17;
  int iVar18;
  uint uVar20;
  int iVar19;
  long lVar21;
  ulong uVar22;
  long lVar23;
  int iVar24;
  int iVar25;
  int iVar26;
  uint uVar27;
  int iVar28;
  DFG_INTERVAL *pDVar29;
  int iVar30;
  uint uVar31;
  int iVar32;
  long lVar33;
  int iVar34;
  long lVar35;
  int iVar36;
  double *pdVar37;
  uint uVar38;
  DECODER_MODEL *decoder_model;
  bool bVar39;
  double dVar40;
  double dVar41;
  ulong uVar42;
  double dVar43;
  double dVar44;
  undefined1 auVar45 [16];
  ulong uVar46;
  undefined1 auVar47 [16];
  undefined1 auVar48 [16];
  undefined1 auVar49 [16];
  
  uVar1._0_4_ = (cpi->common).width;
  uVar1._4_4_ = (cpi->common).height;
  iVar13 = (cpi->common).tiles.rows;
  if ((long)iVar13 < 1) {
    iVar25 = 0;
    uVar38 = 1;
    iVar24 = 0;
    uVar46 = DAT_004dbea0;
  }
  else {
    uVar27 = (cpi->common).tiles.cols;
    piVar15 = &(cpi->tile_data->tile_info).mi_col_end;
    uVar38 = 1;
    lVar21 = 0;
    iVar25 = 0;
    iVar24 = 0;
    auVar48 = _DAT_004dbea0;
    do {
      if (0 < (int)uVar27) {
        uVar7 = (cpi->common).width;
        uVar11 = (cpi->common).height;
        lVar35 = 0;
        do {
          iVar5 = *(int *)((long)piVar15 + lVar35 + -4);
          iVar36 = *(int *)((long)piVar15 + lVar35) - iVar5;
          iVar6 = *(int *)((long)piVar15 + lVar35 + -0xc);
          iVar26 = (*(int *)((long)piVar15 + lVar35 + -8) - iVar6) * iVar36 * 0x10;
          if (iVar26 < iVar25) {
            iVar26 = iVar25;
          }
          iVar25 = iVar26;
          iVar30 = (uint)(cpi->common).superres_scale_denominator * 4 * iVar36;
          iVar26 = iVar30 + 7;
          if (-1 < iVar30) {
            iVar26 = iVar30;
          }
          iVar30 = iVar26 >> 3;
          if (iVar26 >> 3 < iVar24) {
            iVar30 = iVar24;
          }
          iVar24 = iVar30;
          if (*(int *)((long)piVar15 + lVar35) != (cpi->common).mi_params.mi_cols) {
            if (uVar7 == (cpi->common).superres_upscaled_width) {
              bVar39 = SBORROW4(iVar36,0x10);
              iVar26 = -0x10;
            }
            else {
              bVar39 = SBORROW4(iVar36,0x20);
              iVar26 = -0x20;
            }
            if (bVar39 != iVar36 + iVar26 < 0) {
              uVar38 = 0;
            }
          }
          auVar45._0_4_ = uVar7 + iVar5 * -4;
          auVar45._4_4_ = uVar11 + iVar6 * -4;
          auVar45._8_8_ = 0;
          auVar47._0_4_ = -(uint)(auVar48._0_4_ < auVar45._0_4_);
          auVar47._4_4_ = -(uint)(auVar48._4_4_ < auVar45._4_4_);
          auVar47._8_4_ = -(uint)(auVar48._8_4_ < 0);
          auVar47._12_4_ = -(uint)(auVar48._12_4_ < 0);
          auVar48 = ~auVar47 & auVar45 | auVar48 & auVar47;
          lVar35 = lVar35 + 0x5d10;
        } while ((ulong)uVar27 * 0x5d10 - lVar35 != 0);
      }
      uVar46 = auVar48._0_8_;
      lVar21 = lVar21 + 1;
      piVar15 = piVar15 + (ulong)uVar27 * 0x1744;
    } while (lVar21 != iVar13);
  }
  iVar5 = (cpi->common).tiles.cols;
  pAVar8 = cpi->ppi;
  iVar30 = (cpi->common).superres_upscaled_width * uVar1._4_4_;
  iVar6 = cpi->frame_header_count;
  iVar26 = (cpi->common).show_frame;
  iVar36 = (cpi->common).show_existing_frame;
  dVar40 = av1_get_compression_ratio(&cpi->common,size);
  pSVar9 = (cpi->common).seq_params;
  if (-1 < pSVar9->operating_points_cnt_minus_1) {
    iVar13 = iVar13 * iVar5;
    profile = pSVar9->profile;
    bVar4 = pSVar9->still_picture;
    auVar48._8_4_ = (int)(size >> 0x20);
    auVar48._0_8_ = size;
    auVar48._12_4_ = 0x45300000;
    uVar27 = 1 << ((char)(cpi->common).spatial_layer_id + 8U & 0x1f) |
             1 << ((byte)(cpi->common).temporal_layer_id & 0x1f);
    lVar21 = 0;
    do {
      if (((pSVar9->operating_point_idc[lVar21] == 0) ||
          ((pSVar9->operating_point_idc[lVar21] & uVar27) == uVar27)) &&
         (((pAVar8->level_params).keep_level_stats >> ((uint)lVar21 & 0x1f) & 1) != 0)) {
        level_info = (pAVar8->level_params).level_info[lVar21];
        iVar34 = (level_info->level_stats).max_tile_size;
        if (iVar34 <= iVar25) {
          iVar34 = iVar25;
        }
        iVar28 = (level_info->level_stats).max_superres_tile_width;
        if (iVar28 <= iVar24) {
          iVar28 = iVar24;
        }
        (level_info->level_stats).max_tile_size = iVar34;
        (level_info->level_stats).max_superres_tile_width = iVar28;
        uVar42._0_4_ = (level_info->level_stats).min_cropped_tile_width;
        uVar42._4_4_ = (level_info->level_stats).min_cropped_tile_height;
        uVar22 = CONCAT44(-(uint)((int)uVar42._4_4_ < (int)(uVar46 >> 0x20)),
                          -(uint)((int)(undefined4)uVar42 < (int)uVar46));
        uVar42 = ~uVar22 & uVar46 | uVar42 & uVar22;
        (level_info->level_stats).min_cropped_tile_width = (int)uVar42;
        (level_info->level_stats).min_cropped_tile_height = (int)(uVar42 >> 0x20);
        piVar15 = &(level_info->level_stats).tile_width_is_valid;
        *piVar15 = *piVar15 & uVar38;
        uVar22._0_4_ = (level_info->level_stats).min_frame_width;
        uVar22._4_4_ = (level_info->level_stats).min_frame_height;
        uVar42 = CONCAT44(-(uint)((int)uVar22._4_4_ < (int)uVar1._4_4_),
                          -(uint)((int)(undefined4)uVar22 < (int)(undefined4)uVar1));
        uVar42 = ~uVar42 & uVar1 | uVar22 & uVar42;
        (level_info->level_stats).min_frame_width = (int)uVar42;
        (level_info->level_stats).min_frame_height = (int)(uVar42 >> 0x20);
        dVar41 = (level_info->level_stats).min_cr;
        if (dVar40 <= dVar41) {
          dVar41 = dVar40;
        }
        (level_info->level_stats).min_cr = dVar41;
        (level_info->level_stats).total_compressed_size =
             (level_info->level_stats).total_compressed_size +
             (auVar48._8_8_ - 1.9342813113834067e+25) +
             ((double)CONCAT44(0x43300000,(int)size) - 4503599627370496.0);
        iVar34 = (level_info->level_spec).max_picture_size;
        if (iVar34 <= iVar30) {
          iVar34 = iVar30;
        }
        (level_info->level_spec).max_picture_size = iVar34;
        iVar34 = (level_info->level_spec).max_h_size;
        iVar28 = (cpi->common).superres_upscaled_width;
        if (iVar28 < iVar34) {
          iVar28 = iVar34;
        }
        (level_info->level_spec).max_h_size = iVar28;
        iVar34 = (level_info->level_spec).max_v_size;
        if (iVar34 <= (int)uVar1._4_4_) {
          iVar34 = uVar1._4_4_;
        }
        (level_info->level_spec).max_v_size = iVar34;
        iVar34 = (level_info->level_spec).max_tile_cols;
        if (iVar34 <= iVar5) {
          iVar34 = iVar5;
        }
        (level_info->level_spec).max_tile_cols = iVar34;
        iVar34 = (level_info->level_spec).max_tiles;
        if (iVar34 <= iVar13) {
          iVar34 = iVar13;
        }
        (level_info->level_spec).max_tiles = iVar34;
        iVar34 = (level_info->frame_window_buffer).num;
        if (iVar34 < 0x100) {
          (level_info->frame_window_buffer).num = iVar34 + 1;
        }
        else {
          iVar34 = (level_info->frame_window_buffer).start;
          uVar20 = iVar34 + 0x100;
          if (-1 < (int)(iVar34 + 1U)) {
            uVar20 = iVar34 + 1U;
          }
          (level_info->frame_window_buffer).start = (iVar34 - (uVar20 & 0xffffff00)) + 1;
        }
        iVar34 = (level_info->frame_window_buffer).num;
        iVar28 = (level_info->frame_window_buffer).start;
        uVar31 = (iVar28 + iVar34) - 1;
        uVar20 = iVar28 + iVar34 + 0xfe;
        if (-1 < (int)uVar31) {
          uVar20 = uVar31;
        }
        iVar32 = uVar31 - (uVar20 & 0xffffff00);
        (level_info->frame_window_buffer).buf[iVar32].ts_start = ts_start;
        (level_info->frame_window_buffer).buf[iVar32].ts_end = ts_end;
        (level_info->frame_window_buffer).buf[iVar32].encoded_size_in_bytes = size;
        (level_info->frame_window_buffer).buf[iVar32].pic_size = iVar30;
        (level_info->frame_window_buffer).buf[iVar32].frame_header_count = iVar6;
        (level_info->frame_window_buffer).buf[iVar32].tiles = iVar13;
        (level_info->frame_window_buffer).buf[iVar32].show_frame = iVar26;
        (level_info->frame_window_buffer).buf[iVar32].show_existing_frame = iVar36;
        if (iVar26 != 0) {
          lVar35 = (level_info->frame_window_buffer).buf[iVar32].ts_end;
          if (lVar35 < 0x989681) {
            lVar35 = 10000000;
          }
          iVar18 = 1;
          iVar19 = iVar18;
          if (1 < iVar34) {
            do {
              bVar39 = iVar32 < 1;
              iVar32 = iVar32 + -1;
              if (bVar39) {
                iVar32 = 0xff;
              }
              if ((level_info->frame_window_buffer).buf[iVar32].show_frame == 0) {
                bVar39 = false;
              }
              else {
                bVar39 = (level_info->frame_window_buffer).buf[iVar32].ts_start < lVar35 + -10000000
                ;
              }
              iVar19 = iVar18;
            } while ((!bVar39) && (iVar18 = iVar18 + 1, iVar19 = iVar34, iVar34 != iVar18));
          }
          if (iVar34 < iVar19) {
            iVar19 = iVar34;
          }
          if (iVar34 < 1) {
            iVar34 = 0;
            iVar28 = 0;
            lVar33 = 0;
            lVar35 = 0;
            uVar42 = 0;
          }
          else {
            uVar31 = (iVar28 + iVar34) - 1;
            uVar20 = iVar34 + iVar28 + 0xfe;
            if (-1 < (int)uVar31) {
              uVar20 = uVar31;
            }
            iVar32 = uVar31 - (uVar20 & 0xffffff00);
            lVar23 = 0;
            lVar35 = 0;
            lVar33 = 0;
            iVar28 = 0;
            iVar34 = 0;
            do {
              if ((level_info->frame_window_buffer).buf[iVar32].show_existing_frame == 0) {
                iVar34 = iVar34 + (level_info->frame_window_buffer).buf[iVar32].frame_header_count;
                lVar35 = lVar35 + (level_info->frame_window_buffer).buf[iVar32].pic_size;
              }
              if ((level_info->frame_window_buffer).buf[iVar32].show_frame != 0) {
                lVar33 = lVar33 + (level_info->frame_window_buffer).buf[iVar32].pic_size;
              }
              iVar28 = iVar28 + (level_info->frame_window_buffer).buf[iVar32].tiles;
              lVar23 = lVar23 + (level_info->frame_window_buffer).buf[iVar32].encoded_size_in_bytes;
              bVar39 = iVar32 < 1;
              iVar32 = iVar32 + -1;
              if (bVar39) {
                iVar32 = 0xff;
              }
              iVar19 = iVar19 + -1;
            } while (iVar19 != 0);
            uVar42 = lVar23 * 8;
          }
          iVar32 = (level_info->level_stats).max_bitrate;
          iVar19 = (level_info->level_spec).max_header_rate;
          if (iVar34 < iVar19) {
            iVar34 = iVar19;
          }
          (level_info->level_spec).max_header_rate = iVar34;
          lVar23 = (level_info->level_spec).max_display_rate;
          if (lVar33 < lVar23) {
            lVar33 = lVar23;
          }
          (level_info->level_spec).max_display_rate = lVar33;
          lVar33 = (level_info->level_spec).max_decode_rate;
          if (lVar35 < lVar33) {
            lVar35 = lVar33;
          }
          (level_info->level_spec).max_decode_rate = lVar35;
          iVar34 = (level_info->level_spec).max_tile_rate;
          if (iVar28 < iVar34) {
            iVar28 = iVar34;
          }
          (level_info->level_spec).max_tile_rate = iVar28;
          if (0x7ffffffe < uVar42) {
            uVar42 = 0x7fffffff;
          }
          iVar34 = (int)uVar42;
          if ((int)uVar42 < iVar32) {
            iVar34 = iVar32;
          }
          (level_info->level_stats).max_bitrate = iVar34;
          (level_info->level_stats).total_time_encoded =
               (double)((cpi->time_stamps).prev_ts_end - (cpi->time_stamps).prev_ts_start) /
               10000000.0 + (level_info->level_stats).total_time_encoded;
        }
        pdVar37 = &level_info->decoder_models[0].frame_buffer_pool[0].presentation_time;
        piVar15 = &level_info->decoder_models[0].frame_buffer_pool[0].player_ref_count;
        lVar35 = 0;
        do {
          if (level_info->decoder_models[lVar35].status == '\0') {
            decoder_model = level_info->decoder_models + lVar35;
            iVar34 = (cpi->common).show_existing_frame;
            iVar32 = (cpi->common).height * (cpi->common).superres_upscaled_width;
            iVar28 = (cpi->common).show_frame;
            decoder_model->num_frame = decoder_model->num_frame + 1;
            if (iVar34 == 0) {
              decoder_model->num_decoded_frame = decoder_model->num_decoded_frame + 1;
            }
            if (iVar28 != 0 || iVar34 != 0) {
              decoder_model->num_shown_frame = decoder_model->num_shown_frame + 1;
            }
            uVar42 = decoder_model->coded_bits + size * 8;
            decoder_model->coded_bits = uVar42;
            if (iVar34 == 0) {
              iVar19 = decoder_model->decoder_buffer_delay;
              dVar41 = get_removal_time((uint)decoder_model->mode,decoder_model->num_decoded_frame,
                                        iVar19,decoder_model->frame_buffer_pool,
                                        decoder_model->current_time);
              DVar12 = '\x02';
              if (0.0 <= dVar41) {
                dVar44 = decoder_model->removal_time;
                decoder_model->removal_time = dVar41;
                dVar43 = (double)decoder_model->decode_samples / (dVar41 - dVar44);
                decoder_model->decode_samples = iVar32;
                dVar44 = decoder_model->max_decode_rate;
                if (decoder_model->max_decode_rate <= dVar43) {
                  dVar44 = dVar43;
                }
                decoder_model->max_decode_rate = dVar44;
                dVar43 = (double)(iVar19 + decoder_model->encoder_buffer_delay) / -90000.0 + dVar41;
                dVar44 = decoder_model->last_bit_arrival_time;
                if (decoder_model->last_bit_arrival_time <= dVar43) {
                  dVar44 = dVar43;
                }
                decoder_model->first_bit_arrival_time = dVar44;
                auVar49._8_4_ = (int)(uVar42 >> 0x20);
                auVar49._0_8_ = uVar42;
                auVar49._12_4_ = 0x45300000;
                dVar43 = ((auVar49._8_8_ - 1.9342813113834067e+25) +
                         ((double)CONCAT44(0x43300000,(int)uVar42) - 4503599627370496.0)) /
                         decoder_model->bit_rate + dVar44;
                decoder_model->last_bit_arrival_time = dVar43;
                if ((dVar41 < dVar43) && (DVar12 = '\x05', decoder_model->is_low_delay_mode != true)
                   ) goto LAB_001cccb4;
                decoder_model->coded_bits = 0;
                uVar20 = (decoder_model->dfg_interval_queue).head;
                uVar22 = (ulong)(int)uVar20;
                dVar2 = (decoder_model->dfg_interval_queue).buf[uVar22].removal_time;
                if (dVar2 <= dVar43) {
                  pDVar29 = (decoder_model->dfg_interval_queue).buf + uVar22;
                  iVar19 = (decoder_model->dfg_interval_queue).size;
                  do {
                    uVar20 = (uint)uVar22;
                    if (iVar19 < 1) break;
                    dVar3 = (decoder_model->dfg_interval_queue).total_interval;
                    if (1.0 < (dVar2 - dVar44) + dVar3) {
                      DVar12 = '\x06';
                      goto LAB_001cccb4;
                    }
                    (decoder_model->dfg_interval_queue).total_interval =
                         dVar3 - (pDVar29->last_bit_arrival_time - pDVar29->first_bit_arrival_time);
                    uVar31 = uVar20 + 0x40;
                    if (-1 < (int)(uVar20 + 1)) {
                      uVar31 = uVar20 + 1;
                    }
                    uVar20 = (uVar20 - (uVar31 & 0xffffffc0)) + 1;
                    uVar22 = (ulong)uVar20;
                    (decoder_model->dfg_interval_queue).head = uVar20;
                    iVar19 = iVar19 + -1;
                    (decoder_model->dfg_interval_queue).size = iVar19;
                    pDVar29 = (decoder_model->dfg_interval_queue).buf + (int)uVar20;
                    dVar2 = pDVar29->removal_time;
                  } while (dVar2 <= dVar43);
                }
                iVar19 = (decoder_model->dfg_interval_queue).size;
                (decoder_model->dfg_interval_queue).size = iVar19 + 1;
                uVar31 = iVar19 + uVar20;
                uVar20 = iVar19 + uVar20 + 0x3f;
                if (-1 < (int)uVar31) {
                  uVar20 = uVar31;
                }
                iVar19 = uVar31 - (uVar20 & 0xffffffc0);
                (decoder_model->dfg_interval_queue).buf[iVar19].first_bit_arrival_time = dVar44;
                (decoder_model->dfg_interval_queue).buf[iVar19].last_bit_arrival_time = dVar43;
                (decoder_model->dfg_interval_queue).buf[iVar19].removal_time = dVar41;
                dVar44 = (dVar43 - dVar44) + (decoder_model->dfg_interval_queue).total_interval;
                (decoder_model->dfg_interval_queue).total_interval = dVar44;
                DVar12 = '\x06';
                if (1.0 < dVar44) goto LAB_001cccb4;
                lVar33 = 0;
                do {
                  if ((((0 < *(int *)((long)pdVar37 + lVar33 + -0xc)) &&
                       (0.0 <= *(double *)((long)pdVar37 + lVar33))) &&
                      (*(double *)((long)pdVar37 + lVar33) <= dVar41)) &&
                     (*(undefined4 *)((long)pdVar37 + lVar33 + -0xc) = 0,
                     *(int *)((long)pdVar37 + lVar33 + -0x10) == 0)) {
                    *(undefined8 *)((long)pdVar37 + lVar33 + -0x10) = 0;
                    *(undefined4 *)((long)pdVar37 + lVar33 + -8) = 0xffffffff;
                    *(undefined8 *)((long)pdVar37 + lVar33) = 0xbff0000000000000;
                  }
                  lVar33 = lVar33 + 0x18;
                } while (lVar33 != 0xf0);
                dVar44 = 0.0;
                if ((cpi->common).show_existing_frame == 0) {
                  piVar16 = &(cpi->common).height;
                  piVar17 = &(cpi->common).superres_upscaled_width;
                  if (((cpi->common).current_frame.frame_type & 0xfd) != 0) {
                    pSVar10 = (cpi->common).seq_params;
                    piVar17 = &pSVar10->max_frame_width;
                    piVar16 = &pSVar10->max_frame_height;
                  }
                  dVar44 = (double)(*piVar16 * *piVar17) / (double)decoder_model->decode_rate;
                }
                decoder_model->current_time = dVar41 + dVar44;
                uVar22 = 0;
                piVar17 = piVar15;
                do {
                  bVar39 = true;
                  if ((((FRAME_BUFFER *)(piVar17 + -1))->decoder_ref_count == 0) && (*piVar17 == 0))
                  {
                    bVar39 = false;
                    uVar42 = uVar22 & 0xffffffff;
                  }
                  if (!bVar39) goto LAB_001ccbb5;
                  uVar22 = uVar22 + 1;
                  piVar17 = piVar17 + 6;
                } while (uVar22 != 10);
                uVar42 = 0xffffffff;
LAB_001ccbb5:
                DVar12 = '\x02';
                iVar19 = (int)uVar42;
                if (iVar19 < 0) goto LAB_001cccb4;
                decoder_model->frame_buffer_pool[uVar42 & 0xffffffff].frame_type =
                     (cpi->common).current_frame.frame_type;
                update_ref_buffers(decoder_model,iVar19,
                                   (cpi->common).current_frame.refresh_frame_flags);
                bVar39 = true;
                if (decoder_model->initial_presentation_delay <= 0.0 &&
                    decoder_model->initial_presentation_delay != 0.0) {
                  lVar33 = 0;
                  iVar18 = 0;
                  do {
                    if ((0 < *(int *)((long)piVar15 + lVar33 + -4)) ||
                       (0 < *(int *)((long)piVar15 + lVar33))) {
                      iVar18 = iVar18 + 1;
                    }
                    lVar33 = lVar33 + 0x18;
                  } while (lVar33 != 0xf0);
                  if (decoder_model->initial_display_delay + -1 <= iVar18) {
                    dVar41 = decoder_model->current_time;
                    decoder_model->initial_presentation_delay = dVar41;
                    lVar33 = 0;
                    do {
                      if (*(int *)((long)pdVar37 + lVar33 + -0xc) != 0) {
                        dVar44 = -1.0;
                        if ((decoder_model->mode != '\x01') && (dVar44 = -1.0, 0.0 <= dVar41)) {
                          dVar44 = (double)(decoder_model->num_ticks_per_picture *
                                           *(int *)((long)pdVar37 + lVar33 + -8)) *
                                   decoder_model->display_clock_tick + dVar41;
                        }
                        *(double *)((long)pdVar37 + lVar33) = dVar44;
                      }
                      lVar33 = lVar33 + 0x18;
                      bVar39 = true;
                    } while (lVar33 != 0xf0);
                  }
                }
              }
              else {
LAB_001cccb4:
                decoder_model->status = DVar12;
                iVar19 = -1;
                bVar39 = false;
              }
              if (!bVar39) goto LAB_001cc791;
            }
            else {
              iVar19 = decoder_model->vbi[cpi->existing_fb_idx_to_show];
              if ((long)iVar19 < 0) {
                decoder_model->status = '\x03';
                goto LAB_001cc791;
              }
              if (decoder_model->frame_buffer_pool[iVar19].frame_type == '\0') {
                update_ref_buffers(decoder_model,iVar19,0xff);
              }
            }
            if (iVar28 != 0 || iVar34 != 0) {
              piVar17 = &decoder_model->frame_buffer_pool[iVar19].player_ref_count;
              *piVar17 = *piVar17 + 1;
              iVar34 = decoder_model->num_shown_frame;
              decoder_model->frame_buffer_pool[iVar19].display_index = iVar34;
              dVar41 = -1.0;
              if (decoder_model->mode != '\x01') {
                dVar41 = -1.0;
                if (0.0 <= decoder_model->initial_presentation_delay) {
                  dVar41 = (double)(iVar34 * decoder_model->num_ticks_per_picture) *
                           decoder_model->display_clock_tick +
                           decoder_model->initial_presentation_delay;
                }
              }
              decoder_model->frame_buffer_pool[iVar19].presentation_time = dVar41;
              if ((dVar41 < 0.0) || (decoder_model->current_time <= dVar41)) {
                iVar34 = decoder_model->display_samples;
                dVar44 = decoder_model->presentation_time;
                decoder_model->display_samples = iVar32;
                decoder_model->presentation_time = dVar41;
                if ((0.0 <= dVar41) && (0.0 <= dVar44)) {
                  dVar44 = (double)iVar34 / (dVar41 - dVar44);
                  dVar41 = decoder_model->max_display_rate;
                  if (decoder_model->max_display_rate <= dVar44) {
                    dVar41 = dVar44;
                  }
                  decoder_model->max_display_rate = dVar41;
                }
              }
              else {
                decoder_model->status = '\x04';
              }
            }
          }
LAB_001cc791:
          lVar35 = lVar35 + 1;
          pdVar37 = pdVar37 + 0xf6;
          piVar15 = piVar15 + 0x1ec;
        } while (lVar35 != 0x1c);
        level = (pAVar8->level_params).target_seq_level_idx[lVar21];
        if (((level < 0x1c) && ((cpi->oxcf).strict_level_conformance != 0)) &&
           (TVar14 = check_level_constraints
                               (level_info,level,(uint)pSVar9->tier[lVar21],(uint)bVar4,profile,0),
           TVar14 != TARGET_LEVEL_OK)) {
          aom_internal_error((cpi->common).error,AOM_CODEC_ERROR,
                             "Failed to encode to the target level %d_%d. %s",
                             (ulong)((level >> 2) + 2),(ulong)(level & 3),
                             level_fail_messages_rel +
                             *(int *)(level_fail_messages_rel + (ulong)TVar14 * 4));
        }
      }
      bVar39 = lVar21 < pSVar9->operating_points_cnt_minus_1;
      lVar21 = lVar21 + 1;
    } while (bVar39);
  }
  return;
}

Assistant:

void av1_update_level_info(AV1_COMP *cpi, size_t size, int64_t ts_start,
                           int64_t ts_end) {
  AV1_COMMON *const cm = &cpi->common;
  const AV1LevelParams *const level_params = &cpi->ppi->level_params;

  const int upscaled_width = cm->superres_upscaled_width;
  const int width = cm->width;
  const int height = cm->height;
  const int tile_cols = cm->tiles.cols;
  const int tile_rows = cm->tiles.rows;
  const int tiles = tile_cols * tile_rows;
  const int luma_pic_size = upscaled_width * height;
  const int frame_header_count = cpi->frame_header_count;
  const int show_frame = cm->show_frame;
  const int show_existing_frame = cm->show_existing_frame;

  int max_tile_size;
  int min_cropped_tile_width;
  int min_cropped_tile_height;
  int max_superres_tile_width;
  int tile_width_is_valid;
  get_tile_stats(cm, cpi->tile_data, &max_tile_size, &max_superres_tile_width,
                 &min_cropped_tile_width, &min_cropped_tile_height,
                 &tile_width_is_valid);

  const double compression_ratio = av1_get_compression_ratio(cm, size);

  const int temporal_layer_id = cm->temporal_layer_id;
  const int spatial_layer_id = cm->spatial_layer_id;
  const SequenceHeader *const seq_params = cm->seq_params;
  const BITSTREAM_PROFILE profile = seq_params->profile;
  const int is_still_picture = seq_params->still_picture;
  // update level_stats
  // TODO(kyslov@) fix the implementation according to buffer model
  for (int i = 0; i < seq_params->operating_points_cnt_minus_1 + 1; ++i) {
    if (!is_in_operating_point(seq_params->operating_point_idc[i],
                               temporal_layer_id, spatial_layer_id) ||
        !((level_params->keep_level_stats >> i) & 1)) {
      continue;
    }

    AV1LevelInfo *const level_info = level_params->level_info[i];
    assert(level_info != NULL);
    AV1LevelStats *const level_stats = &level_info->level_stats;

    level_stats->max_tile_size =
        AOMMAX(level_stats->max_tile_size, max_tile_size);
    level_stats->max_superres_tile_width =
        AOMMAX(level_stats->max_superres_tile_width, max_superres_tile_width);
    level_stats->min_cropped_tile_width =
        AOMMIN(level_stats->min_cropped_tile_width, min_cropped_tile_width);
    level_stats->min_cropped_tile_height =
        AOMMIN(level_stats->min_cropped_tile_height, min_cropped_tile_height);
    level_stats->tile_width_is_valid &= tile_width_is_valid;
    level_stats->min_frame_width = AOMMIN(level_stats->min_frame_width, width);
    level_stats->min_frame_height =
        AOMMIN(level_stats->min_frame_height, height);
    level_stats->min_cr = AOMMIN(level_stats->min_cr, compression_ratio);
    level_stats->total_compressed_size += (double)size;

    // update level_spec
    // TODO(kyslov@) update all spec fields
    AV1LevelSpec *const level_spec = &level_info->level_spec;
    level_spec->max_picture_size =
        AOMMAX(level_spec->max_picture_size, luma_pic_size);
    level_spec->max_h_size =
        AOMMAX(level_spec->max_h_size, cm->superres_upscaled_width);
    level_spec->max_v_size = AOMMAX(level_spec->max_v_size, height);
    level_spec->max_tile_cols = AOMMAX(level_spec->max_tile_cols, tile_cols);
    level_spec->max_tiles = AOMMAX(level_spec->max_tiles, tiles);

    // Store info. of current frame into FrameWindowBuffer.
    FrameWindowBuffer *const buffer = &level_info->frame_window_buffer;
    store_frame_record(ts_start, ts_end, size, luma_pic_size,
                       frame_header_count, tiles, show_frame,
                       show_existing_frame, buffer);
    if (show_frame) {
      // Count the number of frames encoded in the past 1 second.
      const int encoded_frames_in_last_second =
          show_frame ? count_frames(buffer, TICKS_PER_SEC) : 0;
      scan_past_frames(buffer, encoded_frames_in_last_second, level_spec,
                       level_stats);
      level_stats->total_time_encoded +=
          (cpi->time_stamps.prev_ts_end - cpi->time_stamps.prev_ts_start) /
          (double)TICKS_PER_SEC;
    }

    DECODER_MODEL *const decoder_models = level_info->decoder_models;
    for (AV1_LEVEL level = SEQ_LEVEL_2_0; level < SEQ_LEVELS; ++level) {
      decoder_model_process_frame(cpi, size << 3, &decoder_models[level]);
    }

    // Check whether target level is met.
    const AV1_LEVEL target_level = level_params->target_seq_level_idx[i];
    if (target_level < SEQ_LEVELS && cpi->oxcf.strict_level_conformance) {
      assert(is_valid_seq_level_idx(target_level));
      const int tier = seq_params->tier[i];
      const TARGET_LEVEL_FAIL_ID fail_id = check_level_constraints(
          level_info, target_level, tier, is_still_picture, profile, 0);
      if (fail_id != TARGET_LEVEL_OK) {
        const int target_level_major = 2 + (target_level >> 2);
        const int target_level_minor = target_level & 3;
        aom_internal_error(cm->error, AOM_CODEC_ERROR,
                           "Failed to encode to the target level %d_%d. %s",
                           target_level_major, target_level_minor,
                           level_fail_messages[fail_id]);
      }
    }
  }
}